

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QPointF __thiscall QGraphicsItem::mapFromScene(QGraphicsItem *this,QPointF *point)

{
  QPointF QVar1;
  bool bVar2;
  QGraphicsItemPrivate *pQVar3;
  QPointF *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal in_XMM1_Qa;
  QGraphicsItemPrivate *in_stack_ffffffffffffff60;
  QPointF local_68;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             (in_RDI + 8));
  bVar2 = QGraphicsItemPrivate::hasTranslateOnlySceneTransform(in_stack_ffffffffffffff60);
  if (bVar2) {
    qVar4 = QPointF::x(in_RSI);
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 8));
    qVar5 = QTransform::dx(&pQVar3->sceneTransform);
    qVar6 = QPointF::y(in_RSI);
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 8));
    qVar7 = QTransform::dy(&pQVar3->sceneTransform);
    QPointF::QPointF(&local_68,qVar4 - qVar5,qVar6 - qVar7);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RDI + 8));
    QTransform::inverted((bool *)local_58);
    local_68.xp = (qreal)QTransform::map((QPointF *)local_58);
    local_68.yp = in_XMM1_Qa;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.yp = local_68.yp;
    QVar1.xp = local_68.xp;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsItem::mapFromScene(const QPointF &point) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return QPointF(point.x() - d_ptr->sceneTransform.dx(), point.y() - d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.inverted().map(point);
}